

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_color nk_rgba_f(float r,float g,float b,float a)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  
  fVar6 = 1.0;
  if (r <= 1.0) {
    fVar6 = r;
  }
  uVar3 = 0;
  uVar2 = (int)(fVar6 * 255.0) & 0xff;
  if (fVar6 <= 0.0) {
    uVar2 = uVar3;
  }
  fVar6 = 1.0;
  if (g <= 1.0) {
    fVar6 = g;
  }
  uVar1 = ((int)(fVar6 * 255.0) & 0xffU) << 8;
  if (fVar6 <= 0.0) {
    uVar1 = uVar3;
  }
  fVar6 = 1.0;
  if (b <= 1.0) {
    fVar6 = b;
  }
  uVar5 = ((int)(fVar6 * 255.0) & 0xffU) << 0x10;
  if (fVar6 <= 0.0) {
    uVar5 = uVar3;
  }
  fVar6 = 1.0;
  if (a <= 1.0) {
    fVar6 = a;
  }
  uVar4 = (int)(fVar6 * 255.0) << 0x18;
  if (fVar6 <= 0.0) {
    uVar4 = uVar3;
  }
  return (nk_color)(uVar1 | uVar2 | uVar5 | uVar4);
}

Assistant:

NK_API struct nk_color
nk_rgba_f(float r, float g, float b, float a)
{
    struct nk_color ret;
    ret.r = (nk_byte)(NK_SATURATE(r) * 255.0f);
    ret.g = (nk_byte)(NK_SATURATE(g) * 255.0f);
    ret.b = (nk_byte)(NK_SATURATE(b) * 255.0f);
    ret.a = (nk_byte)(NK_SATURATE(a) * 255.0f);
    return ret;
}